

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O3

void __thiscall backend::codegen::RegAllocator::invalidate_read(RegAllocator *this,int pos)

{
  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *plVar1;
  size_t *psVar2;
  char *pcVar3;
  ostream *poVar4;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> _Var5;
  undefined4 in_register_00000034;
  char *pcVar6;
  Tag *pTVar7;
  _List_node_base *p_Var8;
  ostream local_121;
  Function *local_120;
  size_type local_118;
  undefined1 local_110 [16];
  char *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider _Stack_e8;
  undefined **local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 local_c8;
  undefined7 uStack_c7;
  undefined1 local_b8;
  RegAllocator *local_b0;
  undefined1 local_a8 [25];
  undefined7 uStack_8f;
  undefined8 uStack_88;
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined8 uStack_68;
  size_t local_60;
  bool local_58;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_50;
  undefined **local_48;
  undefined8 local_40;
  undefined1 local_38;
  
  pTVar7 = (Tag *)CONCAT44(in_register_00000034,pos);
  local_121 = (ostream)0x1;
  local_b0 = this;
  AixLog::operator<<(&local_121,(Severity *)pTVar7);
  local_e0 = &PTR__Tag_001eaf88;
  local_d8._8_8_ = 0;
  local_c8 = 0;
  local_b8 = 1;
  local_d8._M_allocated_capacity = (size_type)&local_c8;
  AixLog::operator<<((ostream *)&local_e0,pTVar7);
  local_40 = std::chrono::_V2::system_clock::now();
  local_48 = &PTR__Timestamp_001eaf58;
  local_38 = 0;
  AixLog::operator<<((ostream *)&local_48,(Timestamp *)pTVar7);
  local_120 = (Function *)local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"invalidate_read","");
  pcVar3 = local_f8._M_local_buf + 8;
  pcVar6 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
  ;
  local_100 = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,"");
  local_a8._8_8_ = local_a8 + 0x18;
  local_a8._0_8_ = &PTR__Function_001eafb8;
  if (local_120 == (Function *)local_110) {
    uStack_88 = local_110._8_8_;
  }
  else {
    local_a8._8_8_ = local_120;
  }
  uStack_8f = local_110._1_7_;
  local_a8[0x18] = local_110[0];
  local_80._M_p = local_78._M_local_buf + 8;
  local_a8._16_8_ = local_118;
  local_118 = 0;
  local_110[0] = 0;
  if (local_100 == pcVar3) {
    uStack_68 = _Stack_e8._M_p;
  }
  else {
    local_80._M_p = local_100;
  }
  local_78._9_7_ = local_f8._9_7_;
  local_78._M_local_buf[8] = local_f8._M_local_buf[8];
  local_78._M_allocated_capacity = local_f8._M_allocated_capacity;
  local_f8._M_allocated_capacity = 0;
  local_f8._M_local_buf[8] = '\0';
  local_60 = 0xe7;
  local_58 = false;
  local_120 = (Function *)local_110;
  local_100 = pcVar3;
  AixLog::operator<<((ostream *)local_a8,(Function *)pcVar6);
  pcVar6 = "Invalidating: ";
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"Invalidating: ",0xe);
  AixLog::Function::~Function((Function *)local_a8);
  if (local_100 != pcVar3) {
    pcVar6 = (char *)(CONCAT71(local_f8._9_7_,local_f8._M_local_buf[8]) + 1);
    operator_delete(local_100,(ulong)pcVar6);
  }
  if (local_120 != (Function *)local_110) {
    pcVar6 = (char *)(CONCAT71(local_110._1_7_,local_110[0]) + 1);
    operator_delete(local_120,(ulong)pcVar6);
  }
  local_e0 = &PTR__Tag_001eaf88;
  if ((undefined1 *)local_d8._M_allocated_capacity != &local_c8) {
    pcVar6 = (char *)(CONCAT71(uStack_c7,local_c8) + 1);
    operator_delete((void *)local_d8._M_allocated_capacity,(ulong)pcVar6);
  }
  _Var5._M_cur = (__node_type *)(local_b0->active)._M_h._M_before_begin._M_nxt;
  if (_Var5._M_cur != (__node_type *)0x0) {
    local_50 = &(local_b0->active)._M_h;
    plVar1 = &local_b0->active_reg_map;
    pTVar7 = (Tag *)pcVar6;
    do {
      pcVar6 = (char *)_Var5._M_cur;
      p_Var8 = (_List_node_base *)plVar1;
      if ((uint)pos < *(uint *)((long)pcVar6 + 0x10)) {
        _Var5._M_cur = *(__node_type **)pcVar6;
        pcVar6 = (char *)pTVar7;
      }
      else {
        do {
          p_Var8 = (((_List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var8 == (_List_node_base *)plVar1) goto LAB_0017a630;
        } while (*(int *)((long)&p_Var8[1]._M_next + 4) != *(int *)((long)pcVar6 + 8));
        psVar2 = &(local_b0->active_reg_map).
                  super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl._M_node._M_size;
        *psVar2 = *psVar2 - 1;
        std::__detail::_List_node_base::_M_unhook();
        pTVar7 = (Tag *)0x18;
        operator_delete(p_Var8,0x18);
LAB_0017a630:
        local_121 = (ostream)0x1;
        AixLog::operator<<(&local_121,(Severity *)pTVar7);
        local_e0 = &PTR__Tag_001eaf88;
        local_d8._8_8_ = 0;
        local_c8 = 0;
        local_b8 = 1;
        local_d8._M_allocated_capacity = (size_type)&local_c8;
        AixLog::operator<<((ostream *)&local_e0,pTVar7);
        local_40 = std::chrono::_V2::system_clock::now();
        local_48 = &PTR__Timestamp_001eaf58;
        local_38 = 0;
        AixLog::operator<<((ostream *)&local_48,(Timestamp *)pTVar7);
        local_120 = (Function *)local_110;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"invalidate_read","");
        local_100 = pcVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_100,
                   "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
                   ,"");
        local_a8._0_8_ = &PTR__Function_001eafb8;
        local_80._M_p = local_78._M_local_buf + 8;
        if (local_120 == (Function *)local_110) {
          uStack_88 = local_110._8_8_;
          local_a8._8_8_ = (Function *)(local_a8 + 0x18);
        }
        else {
          local_a8._8_8_ = local_120;
        }
        uStack_8f = local_110._1_7_;
        local_a8[0x18] = local_110[0];
        local_a8._16_8_ = local_118;
        local_118 = 0;
        local_110[0] = 0;
        if (local_100 == pcVar3) {
          uStack_68 = _Stack_e8._M_p;
        }
        else {
          local_80._M_p = local_100;
        }
        local_78._9_7_ = local_f8._9_7_;
        local_78._M_local_buf[8] = local_f8._M_local_buf[8];
        local_78._M_allocated_capacity = local_f8._M_allocated_capacity;
        local_f8._M_allocated_capacity = 0;
        local_f8._M_local_buf[8] = '\0';
        local_60 = 0xf6;
        local_58 = false;
        local_120 = (Function *)local_110;
        local_100 = pcVar3;
        AixLog::operator<<((ostream *)local_a8,(Function *)(local_a8 + 0x18));
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        AixLog::Function::~Function((Function *)local_a8);
        if (local_100 != pcVar3) {
          operator_delete(local_100,CONCAT71(local_f8._9_7_,local_f8._M_local_buf[8]) + 1);
        }
        if (local_120 != (Function *)local_110) {
          operator_delete(local_120,CONCAT71(local_110._1_7_,local_110[0]) + 1);
        }
        local_e0 = &PTR__Tag_001eaf88;
        if ((undefined1 *)local_d8._M_allocated_capacity != &local_c8) {
          operator_delete((void *)local_d8._M_allocated_capacity,CONCAT71(uStack_c7,local_c8) + 1);
        }
        _Var5._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::erase(local_50,(const_iterator)pcVar6);
      }
      pTVar7 = (Tag *)pcVar6;
    } while (_Var5._M_cur != (__node_type *)0x0);
  }
  local_121 = (ostream)0x1;
  AixLog::operator<<(&local_121,(Severity *)pcVar6);
  local_e0 = &PTR__Tag_001eaf88;
  local_d8._8_8_ = 0;
  local_c8 = 0;
  local_b8 = 1;
  local_d8._M_allocated_capacity = (size_type)&local_c8;
  AixLog::operator<<((ostream *)&local_e0,(Tag *)pcVar6);
  local_40 = std::chrono::_V2::system_clock::now();
  local_48 = &PTR__Timestamp_001eaf58;
  local_38 = 0;
  AixLog::operator<<((ostream *)&local_48,(Timestamp *)pcVar6);
  local_120 = (Function *)local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"invalidate_read","");
  local_100 = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,"");
  local_a8._0_8_ = &PTR__Function_001eafb8;
  local_80._M_p = local_78._M_local_buf + 8;
  if (local_120 == (Function *)local_110) {
    uStack_88 = local_110._8_8_;
    local_a8._8_8_ = (Function *)(local_a8 + 0x18);
  }
  else {
    local_a8._8_8_ = local_120;
  }
  uStack_8f = local_110._1_7_;
  local_a8[0x18] = local_110[0];
  local_a8._16_8_ = local_118;
  local_118 = 0;
  local_110[0] = 0;
  if (local_100 == pcVar3) {
    uStack_68 = _Stack_e8._M_p;
  }
  else {
    local_80._M_p = local_100;
  }
  local_78._9_7_ = local_f8._9_7_;
  local_78._M_local_buf[8] = local_f8._M_local_buf[8];
  local_78._M_allocated_capacity = local_f8._M_allocated_capacity;
  local_f8._M_allocated_capacity = 0;
  local_f8._M_local_buf[8] = '\0';
  local_60 = 0xfc;
  local_58 = false;
  local_120 = (Function *)local_110;
  local_100 = pcVar3;
  AixLog::operator<<((ostream *)local_a8,(Function *)(local_a8 + 0x18));
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_a8);
  if (local_100 != pcVar3) {
    operator_delete(local_100,CONCAT71(local_f8._9_7_,local_f8._M_local_buf[8]) + 1);
  }
  if (local_120 != (Function *)local_110) {
    operator_delete(local_120,CONCAT71(local_110._1_7_,local_110[0]) + 1);
  }
  local_e0 = &PTR__Tag_001eaf88;
  if ((undefined1 *)local_d8._M_allocated_capacity != &local_c8) {
    operator_delete((void *)local_d8._M_allocated_capacity,CONCAT71(uStack_c7,local_c8) + 1);
  }
  return;
}

Assistant:

void invalidate_read(int pos) {
    LOG(DEBUG) << "Invalidating: ";
    auto it = active.begin();
    while (it != active.end()) {
      if (it->second.end <= pos) {
        // The register is no longer to be read from, thus is freed
        auto ait = active_reg_map.begin();
        while (ait != active_reg_map.end()) {
          auto r = *ait;
          if (r.second == it->first) {
            active_reg_map.erase(ait);
            break;
          } else {
            ait++;
          }
        }
        LOG(DEBUG) << it->first << " ";
        it = active.erase(it);
      } else {
        it++;
      }
    }
    LOG(DEBUG) << std::endl;
  }